

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenRegVm_X86.cpp
# Opt level: O0

void CallWrap(CodeGenRegVmStateContext *vmState,uint functionId)

{
  CodeGenRegVmContext *pCVar1;
  ExternFuncInfo *pEVar2;
  nullcFunc gate;
  uchar *codeStart;
  ExternFuncInfo *target;
  CodeGenRegVmContext *ctx;
  uint functionId_local;
  CodeGenRegVmStateContext *vmState_local;
  
  pCVar1 = vmState->ctx;
  pEVar2 = vmState->ctx->exFunctions;
  if (pEVar2[functionId].regVmAddress == -1) {
    vmState->jitCodeActive = false;
    if (pEVar2[functionId].funcPtrWrap == (_func_void_void_ptr_char_ptr_char_ptr *)0x0) {
      ExecutorX86::Stop(pCVar1->x86rvm,"ERROR: external raw function calls are disabled");
    }
    else {
      (*pEVar2[functionId].funcPtrWrap)
                (pEVar2[functionId].funcPtrWrapTarget,(char *)vmState->tempStackArrayBase,
                 vmState->dataStackTop);
    }
    vmState->jitCodeActive = true;
    if ((pCVar1->x86rvm->callContinue & 1U) == 0) {
      longjmp((__jmp_buf_tag *)vmState,1);
    }
  }
  else {
    (*(code *)vmState->codeLaunchHeader)
              (vmState->instAddress[pEVar2[functionId].regVmAddress],vmState->regFileLastTop);
  }
  return;
}

Assistant:

void CallWrap(CodeGenRegVmStateContext *vmState, unsigned functionId)
{
	CodeGenRegVmContext &ctx = *vmState->ctx;

	ExternFuncInfo &target = vmState->ctx->exFunctions[functionId];

	if(target.regVmAddress == -1)
	{
		vmState->jitCodeActive = false;

		if(target.funcPtrWrap)
		{
			target.funcPtrWrap(target.funcPtrWrapTarget, (char*)vmState->tempStackArrayBase, (char*)vmState->dataStackTop);
		}
		else
		{
#if !defined(NULLC_NO_RAW_EXTERNAL_CALL)
			RunRawExternalFunction(ctx.x86rvm->dcCallVM, ctx.exFunctions[functionId], ctx.exLocals, ctx.exTypes, ctx.exTypeExtra, (unsigned*)vmState->dataStackTop, (unsigned*)vmState->tempStackArrayBase);
#else
			ctx.x86rvm->Stop("ERROR: external raw function calls are disabled");
#endif
		}

		vmState->jitCodeActive = true;

		if(!ctx.x86rvm->callContinue)
			longjmp(vmState->errorHandler, 1);
	}
	else
	{
		unsigned char *codeStart = vmState->instAddress[target.regVmAddress];

		typedef	void (*nullcFunc)(unsigned char *codeStart, RegVmRegister *regFilePtr);
		nullcFunc gate = (nullcFunc)(uintptr_t)vmState->codeLaunchHeader;
		gate(codeStart, vmState->regFileLastTop);
	}
}